

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

bool Imf_3_3::anon_unknown_2::isNegative(float f)

{
  anon_union_4_2_947300a4 u;
  float f_local;
  
  return ((uint)f & 0x80000000) != 0;
}

Assistant:

inline bool
isNegative (float f)
{
    union
    {
        float f;
        int   i;
    } u;
    u.f = f;
    return (u.i & 0x80000000) != 0;
}